

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_163::GlobalTypeOptimization::run(GlobalTypeOptimization *this,Module *module)

{
  FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> **this_00;
  __node_base_ptr *this_01;
  bool *this_02;
  __node_base_ptr *pp_Var1;
  __node_base_ptr *pp_Var2;
  uint uVar3;
  pointer puVar4;
  Global *pGVar5;
  long *plVar6;
  undefined8 *puVar7;
  _Hash_node_base *p_Var8;
  long *plVar9;
  HeapType HVar10;
  bool bVar11;
  uint uVar12;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *pSVar13;
  FieldInfo *pFVar14;
  __node_type *p_Var15;
  size_type sVar16;
  Struct *pSVar17;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *this_03;
  Struct *pSVar18;
  iterator iVar19;
  mapped_type *this_04;
  pointer pFVar20;
  size_type sVar21;
  iterator iVar22;
  size_type sVar23;
  undefined1 auVar24 [8];
  mapped_type *this_05;
  char cVar25;
  undefined **ppuVar26;
  function<std::optional<wasm::HeapType>_(wasm::HeapType)> *getSuper;
  pointer pFVar27;
  ulong uVar28;
  ulong uVar29;
  pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>
  *ppVar30;
  long lVar31;
  size_t *psVar32;
  __node_base_ptr p_Var33;
  size_type __new_size;
  undefined8 *puVar34;
  long *plVar35;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar36;
  _Hash_node_base *p_Var37;
  long *plVar38;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_1;
  size_type *psVar39;
  optional<wasm::HeapType> oVar40;
  reference rVar41;
  undefined1 local_558 [8];
  FieldInfoScanner scanner;
  FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> functionNewInfos;
  FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> functionSetGetInfos;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  publicTypesSet;
  TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> propagator;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> removableIndexes;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  GlobalTypeOptimization *local_2b8;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  uintptr_t local_1f8;
  GlobalTypeOptimization *local_1f0;
  undefined1 local_1e8;
  _Any_data local_198;
  code *local_188;
  code *local_180;
  undefined1 local_170 [8];
  StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> dataFromSubsAndSupersMap;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> publicTypes;
  type dataFromSupersMap;
  undefined1 auStack_d8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> keptFieldsNotInSuper;
  optional<wasm::HeapType> super;
  _Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_a8;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_90;
  undefined1 auStack_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> superIndexes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexesAfterRemoval;
  uint local_44;
  HeapType local_40;
  HeapType type;
  
  if (((module->features).features & 0x400) == 0) {
    return;
  }
  type.id = (uintptr_t)module;
  if ((((this->super_Pass).runner)->options).closedWorld == false) {
    pp_Var2 = &propagator.subTypes.typeSubTypes._M_h._M_single_bucket;
    Fatal::Fatal((Fatal *)pp_Var2);
    Fatal::operator<<((Fatal *)pp_Var2,(char (*) [28])"GTO requires --closed-world");
    Fatal::~Fatal((Fatal *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
  }
  this_00 = &scanner.
             super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
             .functionSetGetInfos;
  StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::
  FunctionStructValuesMap
            ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)this_00,module);
  this_01 = &functionNewInfos.
             super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             ._M_h._M_single_bucket;
  StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::
  FunctionStructValuesMap
            ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)this_01,module);
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .super_Pass.runner =
       (PassRunner *)
       &scanner.
        super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
        .
        super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
        .super_Pass.name._M_string_length;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .super_Pass._vptr_Pass = (_func_int **)0x0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .super_Pass.name._M_dataplus._M_p = (pointer)0x0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .super_Pass.name._M_string_length._0_1_ = 0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .super_Pass.passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = 0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .super_Pass.passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .super_Pass.passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._33_7_ = 0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .replacep = (Expression **)0x0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .currFunction = (Function *)0x0;
  ppuVar26 = &PTR__WalkerPass_011213e0;
  local_558 = (undefined1  [8])&PTR__WalkerPass_011213e0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .currModule = (Module *)this_00;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .functionNewInfos = (FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)this_01;
  Pass::setPassRunner((Pass *)local_558,(this->super_Pass).runner);
  (**(_func_int **)((long)local_558 + 0x10))((Pass *)local_558,module);
  this_02 = &scanner.
             super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
             .
             super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
             .super_Pass.passArg.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_engaged;
  Pass::setPassRunner((Pass *)local_558,(this->super_Pass).runner);
  puVar4 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .currFunction = (Function *)module;
  for (puVar36 = (module->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar36 != puVar4; puVar36 = puVar36 + 1
      ) {
    pGVar5 = (puVar36->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if ((pGVar5->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
      Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
      ::walk((Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
              *)this_02,&pGVar5->init);
    }
  }
  plVar6 = *(long **)(type.id + 0x68);
  for (plVar38 = *(long **)(type.id + 0x60); plVar38 != plVar6; plVar38 = plVar38 + 1) {
    lVar31 = *plVar38;
    if (*(long *)(lVar31 + 0x28) != 0) {
      Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
      ::walk((Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
              *)this_02,(Expression **)(lVar31 + 0x28));
      lVar31 = *plVar38;
    }
    puVar7 = *(undefined8 **)(lVar31 + 0x40);
    for (puVar34 = *(undefined8 **)(lVar31 + 0x38); puVar34 != puVar7; puVar34 = puVar34 + 1) {
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket = (__node_base_ptr)*puVar34;
      Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
      ::walk((Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
              *)this_02,(Expression **)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    }
  }
  plVar6 = *(long **)(type.id + 0x98);
  for (plVar38 = *(long **)(type.id + 0x90); plVar38 != plVar6; plVar38 = plVar38 + 1) {
    if (*(long *)(*plVar38 + 0x30) != 0) {
      Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
      ::walk((Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
              *)this_02,(Expression **)(*plVar38 + 0x30));
    }
  }
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .currFunction = (Function *)0x0;
  psVar39 = &functionSetGetInfos.
             super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             ._M_h._M_bucket_count;
  while (psVar39 = (size_type *)*psVar39, psVar39 != (size_type *)0x0) {
    psVar32 = psVar39 + 4;
    while (psVar32 = (size_t *)*psVar32, psVar32 != (size_t *)0x0) {
      for (uVar12 = 0; uVar28 = (ulong)uVar12,
          uVar28 < (ulong)((long)(psVar32[3] - psVar32[2]) >> 1); uVar12 = uVar12 + 1) {
        pSVar13 = StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                            (&this->combinedSetGetInfos,(HeapType)psVar32[1]);
        pFVar14 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                            (pSVar13,uVar28);
        ppuVar26 = (undefined **)psVar32[2];
        if ((ulong)((long)(psVar32[3] - (long)ppuVar26) >> 1) <= uVar28) {
          __assert_fail("index < this->size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                        ,0x2c,
                        "const T &wasm::StructUtils::StructValues<wasm::(anonymous namespace)::FieldInfo>::operator[](size_t) const [T = wasm::(anonymous namespace)::FieldInfo]"
                       );
        }
        FieldInfo::combine(pFVar14,(FieldInfo *)
                                   ((long)&(((__node_type *)ppuVar26)->super__Hash_node_base)._M_nxt
                                   + uVar28 * 2));
      }
    }
  }
  SubTypes::SubTypes((SubTypes *)&publicTypesSet._M_h._M_single_bucket,(Module *)type.id);
  local_170 = (undefined1  [8])0x0;
  ppVar30 = (pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>
             *)(this->combinedSetGetInfos).
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
               ._M_h._M_bucket_count;
  dataFromSubsAndSupersMap.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_bucket_count = 0;
  dataFromSubsAndSupersMap.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       (this->combinedSetGetInfos).
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_element_count;
  dataFromSubsAndSupersMap.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_element_count =
       *(size_type *)
        &(this->combinedSetGetInfos).
         super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
         ._M_h._M_rehash_policy;
  dataFromSubsAndSupersMap.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_rehash_policy._0_8_ =
       (this->combinedSetGetInfos).
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_rehash_policy._M_next_resize;
  dataFromSubsAndSupersMap.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  dataFromSubsAndSupersMap.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_buckets = (__buckets_ptr)ppVar30;
  local_170 = (undefined1  [8])
              std::
              _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::_M_allocate_buckets
                        ((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_170,(size_type)ppVar30);
  p_Var37 = (this->combinedSetGetInfos).
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
            ._M_h._M_before_begin._M_nxt;
  if (p_Var37 != (_Hash_node_base *)0x0) {
    dataFromSubsAndSupersMap.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    ._M_h._M_bucket_count =
         (size_type)
         std::__detail::
         _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>>,true>>>
         ::operator()((_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>>,true>>>
                       *)(p_Var37 + 1),ppVar30);
    ppVar30 = (pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>
               *)&dataFromSubsAndSupersMap.
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                  ._M_h._M_bucket_count;
    p_Var8 = p_Var37[5]._M_nxt;
    (((__node_type *)
     dataFromSubsAndSupersMap.
     super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
     ._M_h._M_bucket_count)->
    super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>
    ).super__Hash_node_code_cache<true>._M_hash_code = (size_t)p_Var8;
    *(pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>
      **)((long)local_170 +
         ((ulong)p_Var8 %
         (ulong)dataFromSubsAndSupersMap.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_buckets) * 8) = ppVar30;
    p_Var15 = (__node_type *)
              dataFromSubsAndSupersMap.
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              ._M_h._M_bucket_count;
    while (ppuVar26 = (undefined **)p_Var15, p_Var37 = p_Var37->_M_nxt,
          p_Var37 != (_Hash_node_base *)0x0) {
      p_Var15 = std::__detail::
                _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>>,true>>>
                ::operator()((_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>>,true>>>
                              *)(p_Var37 + 1),ppVar30);
      (((__node_type *)ppuVar26)->super__Hash_node_base)._M_nxt = &p_Var15->super__Hash_node_base;
      p_Var8 = p_Var37[5]._M_nxt;
      (p_Var15->
      super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>
      ).super__Hash_node_code_cache<true>._M_hash_code = (size_t)p_Var8;
      uVar28 = (ulong)p_Var8 %
               (ulong)dataFromSubsAndSupersMap.
                      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                      ._M_h._M_buckets;
      if (*(__buckets_ptr)((long)local_170 + uVar28 * 8) == (__node_base_ptr)0x0) {
        *(undefined ***)((long)local_170 + uVar28 * 8) = ppuVar26;
      }
    }
  }
  StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::propagate
            ((TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *)
             &publicTypesSet._M_h._M_single_bucket,
             (StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)local_170,true,
             SUB81(ppuVar26,0));
  publicTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->combinedSetGetInfos).
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                ._M_h._M_buckets;
  dataFromSupersMap.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_buckets =
       (__buckets_ptr)
       (this->combinedSetGetInfos).
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_bucket_count;
  dataFromSupersMap.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_bucket_count =
       (size_type)
       (this->combinedSetGetInfos).
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_before_begin._M_nxt;
  dataFromSupersMap.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       (this->combinedSetGetInfos).
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_element_count;
  dataFromSupersMap.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_element_count =
       *(size_type *)
        &(this->combinedSetGetInfos).
         super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
         ._M_h._M_rehash_policy;
  dataFromSupersMap.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_rehash_policy._0_8_ =
       (this->combinedSetGetInfos).
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_rehash_policy._M_next_resize;
  dataFromSupersMap.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  pp_Var1 = &(this->combinedSetGetInfos).
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             ._M_h._M_single_bucket;
  if ((pointer)pp_Var1 ==
      publicTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    publicTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)&dataFromSupersMap.
                   super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                   ._M_h._M_rehash_policy._M_next_resize;
    dataFromSupersMap.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    ._M_h._M_rehash_policy._M_next_resize = (size_t)*pp_Var1;
  }
  if ((_Hash_node_base *)
      dataFromSupersMap.
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      ._M_h._M_bucket_count != (_Hash_node_base *)0x0) {
    (&(publicTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage)->id)
    [(ulong)((_Hash_node_base *)
            (dataFromSupersMap.
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             ._M_h._M_bucket_count + 0x28))->_M_nxt %
     (ulong)dataFromSupersMap.
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
            ._M_h._M_buckets] =
         (size_t)&dataFromSupersMap.
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                  ._M_h._M_bucket_count;
  }
  (this->combinedSetGetInfos).
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (this->combinedSetGetInfos).
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->combinedSetGetInfos).
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_bucket_count = 1;
  (this->combinedSetGetInfos).
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_buckets = pp_Var1;
  (this->combinedSetGetInfos).
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->combinedSetGetInfos).
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_element_count = 0;
  StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::propagate
            ((TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *)
             &publicTypesSet._M_h._M_single_bucket,
             (StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
             &publicTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,false,
             SUB81(publicTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,0));
  wasm::ModuleUtils::getPublicHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &dataFromSubsAndSupersMap.
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              ._M_h._M_single_bucket,(Module *)type.id);
  getSuper = (function<std::optional<wasm::HeapType>_(wasm::HeapType)> *)0x0;
  std::
  _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
            ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&functionSetGetInfos.
                 super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                 ._M_h._M_single_bucket,
             dataFromSubsAndSupersMap.
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             ._M_h._M_single_bucket,
             publicTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
             .super__Vector_impl_data._M_start,0,
             &propagator.subTypes.typeSubTypes._M_h._M_single_bucket,&local_a8,
             &superIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_198._M_unused._M_object = (void *)0x0;
  local_198._8_8_ = 0;
  local_180 = std::
              _Function_handler<std::optional<wasm::HeapType>_(wasm::HeapType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type-ordering.h:35:5)>
              ::_M_invoke;
  local_188 = std::
              _Function_handler<std::optional<wasm::HeapType>_(wasm::HeapType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type-ordering.h:35:5)>
              ::_M_manager;
  HeapTypeOrdering::supertypesFirst<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_a8,
             (HeapTypeOrdering *)&publicTypesSet._M_h._M_single_bucket,
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_198,getSuper);
  std::_Function_base::~_Function_base((_Function_base *)&local_198);
  dataFromSupersMap.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)local_a8._M_impl.super__Vector_impl_data._M_finish;
  local_90 = &(this->indexesAfterRemovals)._M_h;
  for (p_Var33 = (__node_base_ptr)local_a8._M_impl.super__Vector_impl_data._M_start;
      p_Var33 !=
      dataFromSupersMap.
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      ._M_h._M_single_bucket; p_Var33 = p_Var33 + 1) {
    local_40.id = (uintptr_t)p_Var33->_M_nxt;
    bVar11 = HeapType::isStruct(&local_40);
    if ((bVar11) &&
       (sVar16 = std::
                 _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)&functionSetGetInfos.
                             super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                             ._M_h._M_single_bucket,&local_40), sVar16 == 0)) {
      pSVar17 = HeapType::getStruct(&local_40);
      pSVar13 = StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                          ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)local_170,
                           local_40);
      this_03 = StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                          ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
                           &publicTypes.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,local_40);
      __new_size = 1;
      while( true ) {
        uVar28 = (ulong)((int)__new_size - 1);
        pFVar27 = (pSVar17->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar20 = (pSVar17->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)((long)pFVar20 - (long)pFVar27 >> 4) <= uVar28) break;
        if ((pFVar27[uVar28].mutable_ != Immutable) &&
           (pFVar14 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                                (pSVar13,uVar28), pFVar14->hasWrite == false)) {
          oVar40 = HeapType::getDeclaredSuperType(&local_40);
          propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
               oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
          removableIndexes._M_t._M_impl._0_1_ =
               oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_engaged;
          if (((((undefined1  [16])
                 oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0) ||
              (pSVar18 = HeapType::getStruct((HeapType *)
                                             &propagator.subTypes.typeSubTypes._M_h._M_single_bucket
                                            ),
              (ulong)((long)(pSVar18->fields).
                            super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(pSVar18->fields).
                            super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                            super__Vector_impl_data._M_start >> 4) <= uVar28)) ||
             (((iVar19 = std::
                         _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find(&(this->canBecomeImmutable)._M_h,
                                (key_type *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket)
               , iVar19.
                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                 ._M_cur != (__node_type *)0x0 &&
               (uVar28 < (ulong)*(uint *)((long)iVar19.
                                                super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                                                ._M_cur + 0x28) +
                         (*(long *)((long)iVar19.
                                          super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                                          ._M_cur + 0x20) -
                         *(long *)((long)iVar19.
                                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                                         ._M_cur + 0x10)) * 8)) &&
              (rVar41 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  ((vector<bool,_std::allocator<bool>_> *)
                                   ((long)iVar19.
                                          super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                                          ._M_cur + 0x10),uVar28),
              (*rVar41._M_p & rVar41._M_mask) != 0)))) {
            this_04 = std::__detail::
                      _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this->canBecomeImmutable,&local_40);
            std::vector<bool,_std::allocator<bool>_>::resize(this_04,__new_size,false);
            rVar41 = std::vector<bool,_std::allocator<bool>_>::operator[](this_04,uVar28);
            *rVar41._M_p = *rVar41._M_p | rVar41._M_mask;
          }
        }
        __new_size = (size_type)((int)__new_size + 1);
      }
      removableIndexes._M_t._M_impl._0_8_ = removableIndexes._M_t._M_impl._0_8_ & 0xffffffff00000000
      ;
      removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&removableIndexes;
      removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      for (superIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          (ulong)(uint)superIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage <
          (ulong)((long)pFVar20 - (long)pFVar27 >> 4);
          superIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (uint)superIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
        pFVar14 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                            (pSVar13,(ulong)(uint)superIndexes.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                            );
        bVar11 = pFVar14->hasRead;
        pFVar14 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                            (this_03,(ulong)(uint)superIndexes.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                            );
        cVar25 = '\x01';
        if (pFVar14->hasRead == false) {
          pFVar14 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                              (this_03,(ulong)(uint)superIndexes.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                              );
          cVar25 = pFVar14->hasWrite;
        }
        if ((bVar11 == false) || (cVar25 == '\0')) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                     (uint *)&superIndexes.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        pFVar27 = (pSVar17->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar20 = (pSVar17->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      oVar40 = HeapType::getDeclaredSuperType(&local_40);
      keptFieldsNotInSuper.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      if (((undefined1  [16])
           oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
          (undefined1  [16])0x0) {
        bVar11 = false;
      }
      else {
        sVar21 = std::
                 _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::count(local_90,(key_type *)
                                  &keptFieldsNotInSuper.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar11 = sVar21 != 0;
      }
      if ((bVar11) ||
         (removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0))
      {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &superIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (long)(pSVar17->fields).
                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pSVar17->fields).
                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                         super__Vector_impl_data._M_start >> 4,(allocator_type *)auStack_88);
        uVar12 = 0;
        uVar28 = 0;
        if (oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_engaged == true) {
          auStack_88 = (undefined1  [8])0x0;
          superIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          superIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          iVar22 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(local_90,(key_type *)
                                   &keptFieldsNotInSuper.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (iVar22.
              super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            pSVar18 = HeapType::getStruct((HeapType *)
                                          &keptFieldsNotInSuper.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            makeIdentity((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_d8,
                         (Index)((ulong)((long)(pSVar18->fields).
                                               super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pSVar18->fields).
                                              super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 4));
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88,
                       (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_d8);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_d8);
          }
          else {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       ((long)iVar22.
                              super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                              ._M_cur + 0x10));
          }
          keptFieldsNotInSuper.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          uVar28 = (ulong)((long)superIndexes.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start - (long)auStack_88) >> 2;
          auStack_d8 = (undefined1  [8])0x0;
          keptFieldsNotInSuper.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          uVar12 = 0;
          for (local_44 = 0; uVar29 = (ulong)local_44,
              uVar29 < (ulong)((long)superIndexes.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_88 >>
                              2); local_44 = local_44 + 1) {
            uVar3 = *(pointer)((long)auStack_88 + uVar29 * 4);
            if (uVar3 == 0xffffffff) {
              sVar23 = std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,&local_44);
              if (sVar23 == 0) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_d8,
                           &local_44);
              }
              else {
                *(undefined4 *)
                 (CONCAT44(superIndexes.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_,
                           (uint)superIndexes.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage) +
                 (ulong)local_44 * 4) = 0xffffffff;
              }
            }
            else {
              *(uint *)(CONCAT44(superIndexes.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 (uint)superIndexes.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                       uVar29 * 4) = uVar3;
              if (uVar12 <= uVar3 + 1) {
                uVar12 = uVar3 + 1;
              }
            }
          }
          for (auVar24 = auStack_d8;
              auVar24 !=
              (undefined1  [8])
              keptFieldsNotInSuper.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
              auVar24 = (undefined1  [8])((long)auVar24 + 4)) {
            *(uint *)(CONCAT44(superIndexes.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               (uint)superIndexes.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (ulong)*(uint *)auVar24 * 4) = uVar12;
            uVar12 = uVar12 + 1;
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_d8);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88);
        }
        while( true ) {
          auStack_88._0_4_ = (int)uVar28;
          if ((ulong)((long)(pSVar17->fields).
                            super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(pSVar17->fields).
                            super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                            super__Vector_impl_data._M_start >> 4) <= (uVar28 & 0xffffffff)) break;
          sVar23 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                         (key_type *)auStack_88);
          if (sVar23 == 0) {
            *(uint *)(CONCAT44(superIndexes.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               (uint)superIndexes.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     ((ulong)auStack_88 & 0xffffffff) * 4) = uVar12;
            uVar12 = uVar12 + 1;
          }
          else {
            *(undefined4 *)
             (CONCAT44(superIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                       (uint)superIndexes.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage) +
             ((ulong)auStack_88 & 0xffffffff) * 4) = 0xffffffff;
          }
          uVar28 = (ulong)(auStack_88._0_4_ + 1);
        }
        makeIdentity((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88,
                     (Index)((ulong)((long)indexesAfterRemoval.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                    CONCAT44(superIndexes.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                             _4_4_,(uint)superIndexes.
                                                                                                                  
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            )) >> 2));
        bVar11 = std::operator!=((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &superIndexes.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88);
        if (bVar11) {
          this_05 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_90,&local_40);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (this_05,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &superIndexes.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &superIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    }
  }
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base(&local_a8);
  if ((this->indexesAfterRemovals)._M_h._M_element_count == 0) {
    if ((this->canBecomeImmutable)._M_h._M_element_count == 0) goto LAB_00a04050;
  }
  else {
    removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         &removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    removableIndexes._M_t._M_impl._0_8_ = 0;
    removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         ((ulong)removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
         0xffffffffffffff00);
    local_2c8._M_allocated_capacity = 0;
    local_2c8._8_8_ = 0;
    local_218 = 0;
    uStack_210 = 0;
    local_208 = 0;
    uStack_200 = 0;
    local_1f8 = 0;
    propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
         (__node_base_ptr)&PTR__WalkerPass_01121440;
    local_1e8 = 0;
    pp_Var2 = &propagator.subTypes.typeSubTypes._M_h._M_single_bucket;
    local_1f0 = this;
    Pass::setPassRunner((Pass *)pp_Var2,(this->super_Pass).runner);
    HVar10 = type;
    (*(code *)propagator.subTypes.typeSubTypes._M_h._M_single_bucket[2]._M_nxt)(pp_Var2,type.id);
    Pass::setPassRunner((Pass *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                        (this->super_Pass).runner);
    local_1f8 = HVar10.id;
    plVar6 = *(long **)(HVar10.id + 0x38);
    for (plVar38 = *(long **)(HVar10.id + 0x30); plVar38 != plVar6; plVar38 = plVar38 + 1) {
      if (*(long *)(*plVar38 + 0x20) == 0) {
        Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::walk
                  ((Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_> *)&local_2c8,
                   (Expression **)(*plVar38 + 0x40));
      }
    }
    plVar6 = *(long **)(type.id + 0x68);
    for (plVar38 = *(long **)(type.id + 0x60); plVar38 != plVar6; plVar38 = plVar38 + 1) {
      lVar31 = *plVar38;
      if (*(long *)(lVar31 + 0x28) != 0) {
        Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::walk
                  ((Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_> *)&local_2c8,
                   (Expression **)(lVar31 + 0x28));
        lVar31 = *plVar38;
      }
      plVar9 = *(long **)(lVar31 + 0x40);
      for (plVar35 = *(long **)(lVar31 + 0x38); plVar35 != plVar9; plVar35 = plVar35 + 1) {
        local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar35;
        Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::walk
                  ((Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_> *)&local_2c8,
                   (Expression **)&local_a8);
      }
    }
    plVar6 = *(long **)(type.id + 0x98);
    for (plVar38 = *(long **)(type.id + 0x90); plVar38 != plVar6; plVar38 = plVar38 + 1) {
      if (*(long *)(*plVar38 + 0x30) != 0) {
        Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::walk
                  ((Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_> *)&local_2c8,
                   (Expression **)(*plVar38 + 0x30));
      }
    }
    local_1f8 = 0;
    WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>::~WalkerPass
              ((WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_> *)
               &propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    if ((this->canBecomeImmutable)._M_h._M_element_count == 0 &&
        (this->indexesAfterRemovals)._M_h._M_element_count == 0) goto LAB_00a04050;
  }
  GlobalTypeRewriter::GlobalTypeRewriter
            ((GlobalTypeRewriter *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
             (Module *)type.id);
  propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
       (__node_base_ptr)&PTR__GlobalTypeRewriter_011214a0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8 = this;
  GlobalTypeRewriter::update
            ((GlobalTypeRewriter *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_a8);
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base(&local_a8);
  GlobalTypeRewriter::~GlobalTypeRewriter
            ((GlobalTypeRewriter *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
LAB_00a04050:
  std::
  _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&functionSetGetInfos.
                    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                    ._M_h._M_single_bucket);
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &dataFromSubsAndSupersMap.
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              ._M_h._M_single_bucket);
  std::
  unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ::~unordered_map((unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                    *)&publicTypes.
                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  std::
  unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ::~unordered_map((unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                    *)local_170);
  SubTypes::~SubTypes((SubTypes *)&publicTypesSet._M_h._M_single_bucket);
  WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  ::~WalkerPass((WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
                 *)local_558);
  std::
  unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ::~unordered_map((unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                    *)&functionNewInfos.
                       super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                       ._M_h._M_single_bucket);
  std::
  unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ::~unordered_map((unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                    *)&scanner.
                       super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
                       .functionSetGetInfos);
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "GTO requires --closed-world";
    }

    // Find and analyze struct operations inside each function.
    StructUtils::FunctionStructValuesMap<FieldInfo> functionNewInfos(*module),
      functionSetGetInfos(*module);
    FieldInfoScanner scanner(functionNewInfos, functionSetGetInfos);
    scanner.run(getPassRunner(), module);
    scanner.runOnModuleCode(getPassRunner(), module);

    // Combine the data from the functions.
    functionSetGetInfos.combineInto(combinedSetGetInfos);
    // TODO: combine newInfos as well, once we have a need for that (we will
    //       when we do things like subtyping).

    // Propagate information to super and subtypes on set/get infos:
    //
    //  * For removing unread fields, we can only remove a field if it is never
    //    read in any sub or supertype, as such a read may alias any of those
    //    types (where the field is present).
    //
    //    Note that we *can* propagate reads only to supertypes, but we are
    //    limited in what we optimize. If type A has fields {a, b}, and its
    //    subtype B has the same fields, and if field a is only used in reads of
    //    type B, then we still cannot remove it. If we removed it then A would
    //    have fields {b}, that is, field b would be at index 0, while type B
    //    would still be {a, b} which has field b at index 1, which is not
    //    compatible. The only case in which we can optimize is to remove a
    //    field from the end, that is, we could remove field b from A.
    //    Otherwise, as mentioned before we can only remove a field if we also
    //    remove it from all sub- and super-types.
    //
    //  * For immutability, this is necessary because we cannot have a
    //    supertype's field be immutable while a subtype's is not - they must
    //    match for us to preserve subtyping.
    //
    //    Note that we do not need to care about types here: If the fields were
    //    mutable before, then they must have had identical types for them to be
    //    subtypes (as wasm only allows the type to differ if the fields are
    //    immutable). Note that by making more things immutable we therefore
    //    make it possible to apply more specific subtypes in subtype fields.
    StructUtils::TypeHierarchyPropagator<FieldInfo> propagator(*module);
    auto dataFromSubsAndSupersMap = combinedSetGetInfos;
    propagator.propagateToSuperAndSubTypes(dataFromSubsAndSupersMap);
    auto dataFromSupersMap = std::move(combinedSetGetInfos);
    propagator.propagateToSubTypes(dataFromSupersMap);

    // Find the public types, which we must not modify.
    auto publicTypes = ModuleUtils::getPublicHeapTypes(*module);
    std::unordered_set<HeapType> publicTypesSet(publicTypes.begin(),
                                                publicTypes.end());

    // Process the propagated info. We look at supertypes first, as the order of
    // fields in a supertype is a constraint on what subtypes can do. That is,
    // we decide for each supertype what the optimal order is, and consider that
    // fixed, and then subtypes can decide how to sort fields that they append.
    for (auto type :
         HeapTypeOrdering::supertypesFirst(propagator.subTypes.types)) {
      if (!type.isStruct() || publicTypesSet.count(type)) {
        continue;
      }
      auto& fields = type.getStruct().fields;
      auto& dataFromSubsAndSupers = dataFromSubsAndSupersMap[type];
      auto& dataFromSupers = dataFromSupersMap[type];

      // Process immutability.
      for (Index i = 0; i < fields.size(); i++) {
        if (fields[i].mutable_ == Immutable) {
          // Already immutable; nothing to do.
          continue;
        }

        if (dataFromSubsAndSupers[i].hasWrite) {
          // A set exists.
          continue;
        }

        // The propagation analysis ensures we update immutability in all
        // supers and subs in concert, but it does not take into account
        // visibility, so do that here: we can only become immutable if the
        // parent can as well.
        auto super = type.getDeclaredSuperType();
        if (super) {
          // The super may not contain the field, which is fine, so only check
          // here if the field does exist in both.
          if (i < super->getStruct().fields.size()) {
            // No entry in canBecomeImmutable means nothing in the parent can
            // become immutable, so check for both that and for an entry with
            // "false".
            auto iter = canBecomeImmutable.find(*super);
            if (iter == canBecomeImmutable.end()) {
              continue;
            }
            // The vector is grown only when needed to contain a "true" value,
            // so |i| being out of bounds indicates "false".
            auto& superVec = iter->second;
            if (i >= superVec.size() || !superVec[i]) {
              continue;
            }
          }
        }

        // No set exists. Mark it as something we can make immutable.
        auto& vec = canBecomeImmutable[type];
        vec.resize(i + 1);
        vec[i] = true;
      }

      // Process removability.
      std::set<Index> removableIndexes;
      for (Index i = 0; i < fields.size(); i++) {
        // If there is no read whatsoever, in either subs or supers, then we can
        // remove the field. That is so even if there are writes (it would be a
        // pointless "write-only field").
        auto hasNoReadsAnywhere = !dataFromSubsAndSupers[i].hasRead;

        // Check for reads or writes in ourselves and our supers. If there are
        // none, then operations only happen in our strict subtypes, and those
        // subtypes can define the field there, and we don't need it here.
        auto hasNoReadsOrWritesInSupers =
          !dataFromSupers[i].hasRead && !dataFromSupers[i].hasWrite;

        if (hasNoReadsAnywhere || hasNoReadsOrWritesInSupers) {
          removableIndexes.insert(i);
        }
      }

      // We need to compute the new set of indexes if we are removing fields, or
      // if our parent removed fields. In the latter case, our parent may have
      // reordered fields even if we ourselves are not removing anything, and we
      // must update to match the parent's order.
      auto super = type.getDeclaredSuperType();
      auto superHasUpdates = super && indexesAfterRemovals.count(*super);
      if (!removableIndexes.empty() || superHasUpdates) {
        // We are removing fields. Reorder them to allow that, as in the general
        // case we can only remove fields from the end, so that if our subtypes
        // still need the fields they can append them. For example:
        //
        //  type A     = { x: i32, y: f64 };
        //  type B : A = { x: 132, y: f64, z: v128 };
        //
        // If field x is used in B but never in A then we want to remove it, but
        // we cannot end up with this:
        //
        //  type A     = { y: f64 };
        //  type B : A = { x: 132, y: f64, z: v128 };
        //
        // Here B no longer extends A's fields. Instead, we reorder A, which
        // then imposes the same order on B's fields:
        //
        //  type A     = { y: f64, x: i32 };
        //  type B : A = { y: f64, x: i32, z: v128 };
        //
        // And after that, it is safe to remove x in A: B will then append it,
        // just like it appends z, leading to this:
        //
        //  type A     = { y: f64 };
        //  type B : A = { y: f64, x: i32, z: v128 };
        //
        std::vector<Index> indexesAfterRemoval(fields.size());

        // The next new index to use.
        Index next = 0;

        // If we have a super, then we extend it, and must match its fields.
        // That is, we can only append fields: we cannot reorder or remove any
        // field that is in the super.
        Index numSuperFields = 0;
        if (super) {
          // We have visited the super before. Get the information about its
          // fields.
          std::vector<Index> superIndexes;
          auto iter = indexesAfterRemovals.find(*super);
          if (iter != indexesAfterRemovals.end()) {
            superIndexes = iter->second;
          } else {
            // We did not store any information about the parent, because we
            // found nothing to optimize there. That means it is not removing or
            // reordering anything, so its new indexes are trivial.
            superIndexes = makeIdentity(super->getStruct().fields.size());
          }

          numSuperFields = superIndexes.size();

          // Fields we keep but the super removed will be handled at the end.
          std::vector<Index> keptFieldsNotInSuper;

          // Go over the super fields and handle them.
          for (Index i = 0; i < superIndexes.size(); ++i) {
            auto superIndex = superIndexes[i];
            if (superIndex == RemovedField) {
              if (removableIndexes.count(i)) {
                // This was removed in the super, and in us as well.
                indexesAfterRemoval[i] = RemovedField;
              } else {
                // This was removed in the super, but we actually need it. It
                // must appear after all other super fields, when we get to the
                // proper index for that, later. That is, we are reordering.
                keptFieldsNotInSuper.push_back(i);
              }
            } else {
              // The super kept this field, so we must keep it as well. This can
              // happen when we need the field in both, but also in the corner
              // case where we don't need the field but the super is public.

              // We need to keep it at the same index so we remain compatible.
              indexesAfterRemoval[i] = superIndex;
              // Update |next| to refer to the next available index. Due to
              // possible reordering in the parent, we may not see indexes in
              // order here, so just take the max at each point in time.
              next = std::max(next, superIndex + 1);
            }
          }

          // Handle fields we keep but the super removed.
          for (auto i : keptFieldsNotInSuper) {
            indexesAfterRemoval[i] = next++;
          }
        }

        // Go over the fields only defined in us, and not in any super.
        for (Index i = numSuperFields; i < fields.size(); ++i) {
          if (removableIndexes.count(i)) {
            indexesAfterRemoval[i] = RemovedField;
          } else {
            indexesAfterRemoval[i] = next++;
          }
        }

        // Only store the new indexes we computed if we found something
        // interesting. We might not, if e.g. our parent removes fields and we
        // add them back in the exact order we started with. In such cases,
        // avoid wasting memory and also time later.
        if (indexesAfterRemoval != makeIdentity(indexesAfterRemoval.size())) {
          indexesAfterRemovals[type] = indexesAfterRemoval;
        }
      }
    }

    // If we found fields that can be removed, remove them from instructions.
    // (Note that we must do this first, while we still have the old heap types
    // that we can identify, and only after this should we update all the types
    // throughout the module.)
    if (!indexesAfterRemovals.empty()) {
      removeFieldsInInstructions(*module);
    }

    // Update the types in the entire module.
    if (!indexesAfterRemovals.empty() || !canBecomeImmutable.empty()) {
      updateTypes(*module);
    }
  }